

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  int iVar1;
  long in_RDX;
  long *in_RSI;
  size_t rlen;
  uchar ra [32];
  int overflow;
  uint in_stack_ffffffffffffffac;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  secp256k1_scalar *in_stack_ffffffffffffffc0;
  size_t *in_stack_ffffffffffffffc8;
  undefined1 auStack_28 [4];
  int local_24;
  long local_20;
  long *local_18;
  int local_4;
  
  local_24 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memset(&stack0xffffffffffffffb8,0,0x20);
  if ((*local_18 == local_20) || (*(char *)*local_18 != '\x02')) {
    local_4 = 0;
  }
  else {
    *local_18 = *local_18 + 1;
    iVar1 = secp256k1_der_read_len
                      (in_stack_ffffffffffffffc8,(uchar **)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else if ((in_stack_ffffffffffffffb0 == (secp256k1_scalar *)0x0) ||
            ((secp256k1_scalar *)(local_20 - *local_18) < in_stack_ffffffffffffffb0)) {
      local_4 = 0;
    }
    else if ((*(char *)*local_18 == '\0') &&
            (((secp256k1_scalar *)0x1 < in_stack_ffffffffffffffb0 &&
             ((*(byte *)(*local_18 + 1) & 0x80) == 0)))) {
      local_4 = 0;
    }
    else if ((*(char *)*local_18 == -1) &&
            (((secp256k1_scalar *)0x1 < in_stack_ffffffffffffffb0 &&
             ((*(byte *)(*local_18 + 1) & 0x80) == 0x80)))) {
      local_4 = 0;
    }
    else {
      if ((*(byte *)*local_18 & 0x80) == 0x80) {
        local_24 = 1;
      }
      if ((in_stack_ffffffffffffffb0 != (secp256k1_scalar *)0x0) && (*(char *)*local_18 == '\0')) {
        in_stack_ffffffffffffffb0 =
             (secp256k1_scalar *)((long)in_stack_ffffffffffffffb0[-1].d + 0x1f);
        *local_18 = *local_18 + 1;
      }
      if ((secp256k1_scalar *)0x20 < in_stack_ffffffffffffffb0) {
        local_24 = 1;
      }
      if (local_24 == 0) {
        if (in_stack_ffffffffffffffb0 != (secp256k1_scalar *)0x0) {
          memcpy(auStack_28 + -(long)in_stack_ffffffffffffffb0,(void *)*local_18,
                 (size_t)in_stack_ffffffffffffffb0);
        }
        secp256k1_scalar_set_b32
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (int *)in_stack_ffffffffffffffb0);
      }
      if (local_24 != 0) {
        secp256k1_scalar_set_int(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      *local_18 = (long)in_stack_ffffffffffffffb0->d + *local_18;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    size_t rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    if (secp256k1_der_read_len(&rlen, sig, sigend) == 0) {
        return 0;
    }
    if (rlen == 0 || rlen > (size_t)(sigend - *sig)) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    /* There is at most one leading zero byte:
     * if there were two leading zero bytes, we would have failed and returned 0
     * because of excessive 0x00 padding already. */
    if (rlen > 0 && **sig == 0) {
        /* Skip leading zero byte */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        if (rlen) memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}